

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O2

void Pf_StoPrint(Pf_Man_t *p,int fVerbose)

{
  int GateId;
  Pf_Mat_t Mat;
  Vec_Int_t *p_00;
  uint Count;
  int i;
  int i_00;
  uint i_01;
  
  i_01 = 2;
  Count = 0;
  while( true ) {
    if (p->vTt2Match->nSize <= (int)i_01) break;
    p_00 = Vec_WecEntry(p->vTt2Match,i_01);
    i_00 = 0;
    for (i = 1; i < p_00->nSize; i = i + 2) {
      GateId = Vec_IntEntry(p_00,i + -1);
      Mat = (Pf_Mat_t)Vec_IntEntry(p_00,i);
      Count = Count + 1;
      if (i_01 < 10 && fVerbose != 0) {
        Pf_StoPrintOne(p,Count,i_01,i_00,GateId,Mat);
      }
      i_00 = i_00 + 1;
    }
    i_01 = i_01 + 1;
  }
  printf("Gates = %d.  Truths = %d.  Matches = %d.\n",(ulong)(uint)p->nCells,
         (ulong)(uint)p->vTtMem->nEntries,(ulong)Count);
  return;
}

Assistant:

void Pf_StoPrint( Pf_Man_t * p, int fVerbose )
{
    int t, i, GateId, Entry, Count = 0;
    for ( t = 2; t < Vec_WecSize(p->vTt2Match); t++ )
    {
        Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, t );
        Vec_IntForEachEntryDouble( vArr, GateId, Entry, i )
        {
            Count++;
            if ( !fVerbose )
                continue;
            if ( t < 10 )
                Pf_StoPrintOne( p, Count, t, i/2, GateId, Pf_Int2Mat(Entry) );
        }
    }
    printf( "Gates = %d.  Truths = %d.  Matches = %d.\n", 
        p->nCells, Vec_MemEntryNum(p->vTtMem), Count );
}